

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokStream::CTcTokStream
          (CTcTokStream *this,CTcTokFileDesc *desc,CTcSrcObject *src,CTcTokStream *parent,
          int charset_error,int init_if_level)

{
  this->src_ = src;
  this->desc_ = desc;
  this->parent_ = parent;
  this->next_linenum_ = 1;
  this->field_0x28 = this->field_0x28 & 0xfc | (byte)charset_error & 1;
  this->init_if_level_ = init_if_level;
  return;
}

Assistant:

CTcTokStream::CTcTokStream(CTcTokFileDesc *desc, CTcSrcObject *src,
                           CTcTokStream *parent, int charset_error,
                           int init_if_level)
{
    /* remember the underlying source file */
    src_ = src;

    /* remember the file descriptor */
    desc_ = desc;

    /* remember the containing stream */
    parent_ = parent;

    /* the next line to read is line number 1 */
    next_linenum_ = 1;

    /* remember if there was a #charset error */
    charset_error_ = charset_error;

    /* we're not in a comment yet */
    in_comment_ = FALSE;

    /* remember the starting #if level */
    init_if_level_ = init_if_level;

#if 0 // #pragma C is not currently used
    /* 
     *   start out in parent's pragma C mode, or in non-C mode if we have
     *   no parent 
     */
    if (parent != 0)
        pragma_c_ = parent->is_pragma_c();
    else
        pragma_c_ = TRUE;
#endif
}